

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnni.cpp
# Opt level: O0

void ncnn::pack_B_tile_int8_avxvnni(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  int in_stack_00000158;
  int in_stack_0000015c;
  int in_stack_00000160;
  int in_stack_00000164;
  Mat *in_stack_00000168;
  Mat *in_stack_00000170;
  
  pack_B_tile_int8(in_stack_00000170,in_stack_00000168,in_stack_00000164,in_stack_00000160,
                   in_stack_0000015c,in_stack_00000158);
  return;
}

Assistant:

void pack_B_tile_int8_avxvnni(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    pack_B_tile_int8(B, BT, j, max_jj, k, max_kk);
}